

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue200_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_Test::_Run(_Test_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  Slice SVar3;
  WriteOptions write_options;
  Slice local_298;
  DB *db;
  string local_280;
  Status local_260;
  ReadOptions read_options;
  Status local_248;
  Status local_240;
  string dbpath;
  Tester local_218;
  Options options;
  long *plVar2;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(&dbpath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_218,"/leveldb_issue200_test");
  std::__cxx11::string::~string((string *)&local_218);
  Options::Options((Options *)&local_218);
  DestroyDB((leveldb *)&local_240,&dbpath,(Options *)&local_218);
  Status::~Status(&local_240);
  Options::Options(&options);
  options.create_if_missing = true;
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x18);
  DB::Open((DB *)&local_280,&options,&dbpath,&db);
  test::Tester::IsOk(&local_218,(Status *)&local_280);
  Status::~Status((Status *)&local_280);
  test::Tester::~Tester(&local_218);
  write_options.sync = false;
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1b);
  local_280._M_dataplus._M_p = "1";
  local_280._M_string_length = 1;
  read_options._0_8_ = (long)".ldb" + 3;
  read_options.snapshot = (Snapshot *)0x1;
  (*db->_vptr_DB[2])(&local_298,db,&write_options);
  test::Tester::IsOk(&local_218,(Status *)&local_298);
  Status::~Status((Status *)&local_298);
  test::Tester::~Tester(&local_218);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1c);
  local_280._M_dataplus._M_p = "2";
  local_280._M_string_length = 1;
  read_options._0_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/arena.cc" +
       0x56;
  read_options.snapshot = (Snapshot *)0x1;
  (*db->_vptr_DB[2])(&local_298,db,&write_options);
  test::Tester::IsOk(&local_218,(Status *)&local_298);
  Status::~Status((Status *)&local_298);
  test::Tester::~Tester(&local_218);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1d);
  local_280._M_dataplus._M_p = "3";
  local_280._M_string_length = 1;
  read_options._0_8_ = (long)"/tmp/leveldbtest-%d" + 0x12;
  read_options.snapshot = (Snapshot *)0x1;
  (*db->_vptr_DB[2])(&local_298,db,&write_options);
  test::Tester::IsOk(&local_218,(Status *)&local_298);
  Status::~Status((Status *)&local_298);
  test::Tester::~Tester(&local_218);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1e);
  local_280._M_dataplus._M_p = "4";
  local_280._M_string_length = 1;
  read_options._0_8_ = (long)"num <= space" + 0xb;
  read_options.snapshot = (Snapshot *)0x1;
  (*db->_vptr_DB[2])(&local_298,db,&write_options);
  test::Tester::IsOk(&local_218,(Status *)&local_298);
  Status::~Status((Status *)&local_298);
  test::Tester::~Tester(&local_218);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x1f);
  local_280._M_dataplus._M_p = "5";
  local_280._M_string_length = 1;
  read_options._0_8_ = (long)"length <= 0xffff" + 0xf;
  read_options.snapshot = (Snapshot *)0x1;
  (*db->_vptr_DB[2])(&local_298,db,&write_options);
  test::Tester::IsOk(&local_218,(Status *)&local_298);
  Status::~Status((Status *)&local_298);
  test::Tester::~Tester(&local_218);
  read_options.verify_checksums = false;
  read_options.fill_cache = true;
  read_options.snapshot = (Snapshot *)0x0;
  iVar1 = (*db->_vptr_DB[6])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x25);
  local_280._M_dataplus._M_p = "25";
  local_280._M_string_length = 2;
  local_298.data_ = "cd";
  local_298.size_ = 2;
  (*db->_vptr_DB[2])(&local_260,db,&write_options);
  test::Tester::IsOk(&local_218,&local_260);
  Status::~Status(&local_260);
  test::Tester::~Tester(&local_218);
  local_218._0_8_ = "5";
  local_218.fname_ = (char *)0x1;
  (**(code **)(*plVar2 + 0x28))(plVar2,&local_218);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x28);
  local_298 = (Slice)(**(code **)(*plVar2 + 0x40))(plVar2);
  Slice::ToString_abi_cxx11_(&local_280,&local_298);
  test::Tester::IsEq<std::__cxx11::string,char[2]>(&local_218,&local_280,(char (*) [2])0x1211a8);
  std::__cxx11::string::~string((string *)&local_280);
  test::Tester::~Tester(&local_218);
  (**(code **)(*plVar2 + 0x38))(plVar2);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2a);
  SVar3 = (Slice)(**(code **)(*plVar2 + 0x40))(plVar2);
  local_298 = SVar3;
  Slice::ToString_abi_cxx11_(&local_280,&local_298);
  test::Tester::IsEq<std::__cxx11::string,char[2]>(&local_218,&local_280,(char (*) [2])"4");
  std::__cxx11::string::~string((string *)&local_280);
  test::Tester::~Tester(&local_218);
  (**(code **)(*plVar2 + 0x38))(plVar2);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2c);
  SVar3 = (Slice)(**(code **)(*plVar2 + 0x40))(plVar2);
  local_298 = SVar3;
  Slice::ToString_abi_cxx11_(&local_280,&local_298);
  test::Tester::IsEq<std::__cxx11::string,char[2]>(&local_218,&local_280,(char (*) [2])"3");
  std::__cxx11::string::~string((string *)&local_280);
  test::Tester::~Tester(&local_218);
  (**(code **)(*plVar2 + 0x30))(plVar2);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x2e);
  SVar3 = (Slice)(**(code **)(*plVar2 + 0x40))(plVar2);
  local_298 = SVar3;
  Slice::ToString_abi_cxx11_(&local_280,&local_298);
  test::Tester::IsEq<std::__cxx11::string,char[2]>(&local_218,&local_280,(char (*) [2])"4");
  std::__cxx11::string::~string((string *)&local_280);
  test::Tester::~Tester(&local_218);
  (**(code **)(*plVar2 + 0x30))(plVar2);
  test::Tester::Tester
            (&local_218,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue200_test.cc"
             ,0x30);
  SVar3 = (Slice)(**(code **)(*plVar2 + 0x40))(plVar2);
  local_298 = SVar3;
  Slice::ToString_abi_cxx11_(&local_280,&local_298);
  test::Tester::IsEq<std::__cxx11::string,char[2]>(&local_218,&local_280,(char (*) [2])0x1211a8);
  std::__cxx11::string::~string((string *)&local_280);
  test::Tester::~Tester(&local_218);
  (**(code **)(*plVar2 + 8))(plVar2);
  if (db != (DB *)0x0) {
    (*db->_vptr_DB[1])();
  }
  DestroyDB((leveldb *)&local_248,&dbpath,&options);
  Status::~Status(&local_248);
  std::__cxx11::string::~string((string *)&dbpath);
  return;
}

Assistant:

TEST(Issue200, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = test::TmpDir() + "/leveldb_issue200_test";
  DestroyDB(dbpath, Options());

  DB* db;
  Options options;
  options.create_if_missing = true;
  ASSERT_OK(DB::Open(options, dbpath, &db));

  WriteOptions write_options;
  ASSERT_OK(db->Put(write_options, "1", "b"));
  ASSERT_OK(db->Put(write_options, "2", "c"));
  ASSERT_OK(db->Put(write_options, "3", "d"));
  ASSERT_OK(db->Put(write_options, "4", "e"));
  ASSERT_OK(db->Put(write_options, "5", "f"));

  ReadOptions read_options;
  Iterator* iter = db->NewIterator(read_options);

  // Add an element that should not be reflected in the iterator.
  ASSERT_OK(db->Put(write_options, "25", "cd"));

  iter->Seek("5");
  ASSERT_EQ(iter->key().ToString(), "5");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "3");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "5");

  delete iter;
  delete db;
  DestroyDB(dbpath, options);
}